

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
          (HighsHashTable<std::tuple<int,int,unsigned_int>,void> *this,int *args,int *args_1,
          uint *args_2)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  u8 meta;
  Entry entry;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_31;
  KeyType local_30;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Tuple_impl<1UL,_int,_unsigned_int>.
  super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
       (_Head_base<2UL,_unsigned_int,_false>)*args_2;
  local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Tuple_impl<1UL,_int,_unsigned_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = *args_1;
  local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = *args;
  bVar6 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
                    ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)this,&local_30,
                     &local_31,&local_10,&local_18,&local_20);
  if (bVar6) {
    bVar6 = false;
  }
  else {
    uVar9 = *(ulong *)(this + 0x10);
    if ((*(ulong *)(this + 0x20) != uVar9 * 7 + 7 >> 3) && (local_20 != local_18)) {
      lVar4 = *(long *)this;
      *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
      uVar10 = local_18;
      do {
        lVar7 = *(long *)(this + 8);
        if (-1 < (char)*(byte *)(lVar7 + local_20)) {
          *(u8 *)(lVar7 + local_20) = local_31;
          lVar7 = local_20 * 0xc;
          *(_Head_base<2UL,_unsigned_int,_false> *)(lVar4 + lVar7) =
               local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
               super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
          *(int *)(lVar4 + 4 + lVar7) =
               local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
               super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>.
               _M_head_impl;
          *(int *)(lVar4 + 8 + lVar7) =
               local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
               super__Head_base<0UL,_int,_false>._M_head_impl;
          return true;
        }
        uVar11 = (ulong)((int)local_20 - (uint)*(byte *)(lVar7 + local_20) & 0x7f);
        if (uVar11 < (local_20 - local_10 & uVar9)) {
          lVar8 = local_20 * 0xc;
          iVar2 = *(int *)(lVar4 + 8 + lVar8);
          iVar3 = *(int *)(lVar4 + 4 + lVar8);
          uVar5 = CONCAT44(local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
                           super__Tuple_impl<1UL,_int,_unsigned_int>.
                           super__Head_base<1UL,_int,_false>._M_head_impl,
                           local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
                           super__Tuple_impl<1UL,_int,_unsigned_int>.
                           super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl);
          local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
               *(_Head_base<2UL,_unsigned_int,_false> *)(lVar4 + lVar8);
          *(int *)(lVar4 + 8 + lVar8) =
               local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
               super__Head_base<0UL,_int,_false>._M_head_impl;
          *(undefined8 *)(lVar4 + lVar8) = uVar5;
          uVar1 = *(u8 *)(lVar7 + local_20);
          *(u8 *)(lVar7 + local_20) = local_31;
          uVar9 = *(ulong *)(this + 0x10);
          local_10 = local_20 - uVar11 & uVar9;
          uVar10 = local_10 + 0x7f & uVar9;
          local_31 = uVar1;
          local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
          super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               iVar3;
          local_30.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = iVar2;
          local_18 = uVar10;
        }
        local_20 = local_20 + 1 & uVar9;
      } while (local_20 != uVar10);
      HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::growTable
                ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)this);
      insert<HighsHashTableEntry<std::tuple<int,int,unsigned_int>,void>>
                (this,(HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)&local_30);
      return true;
    }
    HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::growTable
              ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)this);
    bVar6 = insert<HighsHashTableEntry<std::tuple<int,int,unsigned_int>,void>>
                      (this,(HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
                            &local_30);
  }
  return bVar6;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }